

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_declaration.c
# Opt level: O0

mpc_val_t * fold_declaration(int n,mpc_val_t **xs)

{
  undefined8 *__ptr;
  undefined8 *__ptr_00;
  int iVar1;
  long *plVar2;
  undefined1 *puVar3;
  char *doc;
  c_declaration_t *declaration;
  mpc_state_t *end_state;
  mpc_state_t *start_state;
  mpc_val_t **xs_local;
  int n_local;
  
  __ptr = (undefined8 *)*xs;
  __ptr_00 = (undefined8 *)xs[6];
  plVar2 = (long *)malloc(0x28);
  *plVar2 = (long)xs[1];
  *(undefined4 *)(plVar2 + 1) = 0;
  plVar2[2] = (long)xs[3];
  plVar2[3] = (long)xs[4];
  *(int *)(plVar2 + 4) = (int)*__ptr;
  *(int *)((long)plVar2 + 0x24) = (int)*__ptr_00;
  if (xs[2] != (mpc_val_t *)0x0) {
    iVar1 = strcmp((char *)xs[2],"typedef");
    if (iVar1 == 0) {
      *(undefined4 *)(plVar2 + 1) = 1;
    }
  }
  if (*plVar2 == 0) {
    puVar3 = (undefined1 *)malloc(1);
    *puVar3 = 0;
    *plVar2 = (long)puVar3;
  }
  free(__ptr);
  free(xs[2]);
  free(xs[5]);
  free(__ptr_00);
  return plVar2;
}

Assistant:

static mpc_val_t *fold_declaration(int n, mpc_val_t **xs)
{
    mpc_state_t *start_state = xs[0];
    mpc_state_t *end_state = xs[6];

    c_declaration_t *declaration = malloc(sizeof(c_declaration_t));
    declaration->doc = xs[1];
    declaration->storage_class = C_STORAGE_CLASS_NONE;
    declaration->type_specifier = xs[3];
    declaration->declarator = xs[4];
    declaration->position_start = start_state->pos;
    declaration->position_end = end_state->pos;

    if (xs[2] != NULL && strcmp(xs[2], "typedef") == 0) {
        declaration->storage_class = C_STORAGE_CLASS_TYPEDEF;
    }

    if (declaration->doc == NULL) {
        char *doc = malloc(1);
        doc[0] = '\0';
        declaration->doc = doc;
    }

    free(start_state);
    free(xs[2]);
    free(xs[5]);
    free(end_state);

    return declaration;
}